

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

CURLcode http2_cfilter_add(Curl_cfilter **pcf,Curl_easy *data,connectdata *conn,int sockindex)

{
  CURLcode CVar1;
  cf_h2_ctx *ctx;
  Curl_cfilter *cf;
  
  cf = (Curl_cfilter *)0x0;
  ctx = (cf_h2_ctx *)(*Curl_ccalloc)(1,0xd0);
  if (ctx == (cf_h2_ctx *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CVar1 = Curl_cf_create(&cf,&Curl_cft_nghttp2,ctx);
    if (CVar1 == CURLE_OK) {
      Curl_conn_cf_add(data,conn,sockindex,cf);
      CVar1 = CURLE_OK;
      goto LAB_00574bad;
    }
  }
  cf_h2_ctx_free(ctx);
  cf = (Curl_cfilter *)0x0;
LAB_00574bad:
  *pcf = cf;
  return CVar1;
}

Assistant:

static CURLcode http2_cfilter_add(struct Curl_cfilter **pcf,
                                  struct Curl_easy *data,
                                  struct connectdata *conn,
                                  int sockindex)
{
  struct Curl_cfilter *cf = NULL;
  struct cf_h2_ctx *ctx;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(data->conn);
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx)
    goto out;

  result = Curl_cf_create(&cf, &Curl_cft_nghttp2, ctx);
  if(result)
    goto out;

  Curl_conn_cf_add(data, conn, sockindex, cf);
  result = CURLE_OK;

out:
  if(result)
    cf_h2_ctx_free(ctx);
  *pcf = result? NULL : cf;
  return result;
}